

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.cxx
# Opt level: O0

void __thiscall
cmWhileFunctionBlocker::cmWhileFunctionBlocker
          (cmWhileFunctionBlocker *this,cmMakefile *mf,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args)

{
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args_local;
  cmMakefile *mf_local;
  cmWhileFunctionBlocker *this_local;
  
  cmFunctionBlocker::cmFunctionBlocker(&this->super_cmFunctionBlocker);
  (this->super_cmFunctionBlocker)._vptr_cmFunctionBlocker =
       (_func_int **)&PTR__cmWhileFunctionBlocker_01552038;
  this->Makefile = mf;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector(&this->Args,args);
  cmMakefile::PushLoopBlock(this->Makefile);
  return;
}

Assistant:

cmWhileFunctionBlocker::cmWhileFunctionBlocker(
  cmMakefile* const mf, std::vector<cmListFileArgument> args)
  : Makefile{ mf }
  , Args{ std::move(args) }
{
  this->Makefile->PushLoopBlock();
}